

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int ParseEXRHeaderFromMemory
              (EXRAttribute *customAttributes,int *numCustomAttributes,int *width,int *height,
              uchar *memory)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  uchar *puVar8;
  reference __src;
  int *piVar9;
  ulong uVar10;
  long lVar11;
  uchar *puVar12;
  int iVar13;
  bool bVar14;
  size_type sStack_140;
  int local_12c;
  int local_128;
  int local_124;
  int local_120;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  long local_f0;
  vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> attribs;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  channels;
  string attrName;
  string attrType;
  EXRAttribute attrib;
  
  if (memory == (uchar *)0x0) {
    iVar13 = -1;
  }
  else if (*(int *)memory == 0x1312f76) {
    iVar13 = -4;
    if ((((memory[4] == '\x02') && (memory[5] == '\0')) && (memory[6] == '\0')) &&
       (memory[7] == '\0')) {
      channels.
      super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      channels.
      super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      channels.
      super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      attribs.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      attribs.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      attribs.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (numCustomAttributes != (int *)0x0) {
        *numCustomAttributes = 0;
      }
      puVar12 = memory + 8;
      iVar13 = -3;
      local_12c = -1;
      local_f0 = -1;
      local_128 = local_12c;
      local_124 = local_12c;
      local_120 = local_12c;
      do {
        attrName._M_dataplus._M_p = (pointer)&attrName.field_2;
        attrName._M_string_length = 0;
        attrName.field_2._M_local_buf[0] = '\0';
        attrType._M_dataplus._M_p = (pointer)&attrType.field_2;
        attrType._M_string_length = 0;
        attrType.field_2._M_local_buf[0] = '\0';
        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        puVar8 = (uchar *)anon_unknown.dwarf_ec2bc::ReadAttribute
                                    (&attrName,&attrType,
                                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     &data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ,(char *)puVar12);
        if (puVar8 == (uchar *)0x0) {
          puVar12 = puVar12 + 1;
          iVar7 = 2;
          iVar6 = iVar13;
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)&attrName);
          if (iVar7 == 0) {
            iVar7 = 1;
            iVar6 = -5;
            if (4 < *data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start) goto LAB_00139734;
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)&attrName);
            if (iVar7 == 0) {
              anon_unknown.dwarf_ec2bc::ReadChannelInfo
                        (&channels,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
              local_f0 = ((long)channels.
                                super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)channels.
                               super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x30;
              iVar7 = 1;
              iVar6 = -6;
              if ((int)local_f0 < 1) goto LAB_00139734;
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)&attrName);
              if (iVar7 == 0) {
                piVar9 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           &data.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ,0);
                local_120 = *piVar9;
                piVar9 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           &data.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ,4);
                local_124 = *piVar9;
                piVar9 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           &data.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ,8);
                local_128 = *piVar9;
                piVar9 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           &data.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ,0xc);
                local_12c = *piVar9;
              }
              else {
                iVar7 = std::__cxx11::string::compare((char *)&attrName);
                if (iVar7 == 0) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ,0);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ,4);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ,8);
                  sStack_140 = 0xc;
                }
                else {
                  iVar7 = std::__cxx11::string::compare((char *)&attrName);
                  if ((iVar7 != 0) &&
                     (iVar7 = std::__cxx11::string::compare((char *)&attrName), iVar7 != 0)) {
                    iVar7 = std::__cxx11::string::compare((char *)&attrName);
                    if (iVar7 == 0) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                                 0);
                      sStack_140 = 4;
                      goto LAB_0013971f;
                    }
                    iVar7 = std::__cxx11::string::compare((char *)&attrName);
                    if (iVar7 != 0) {
                      if ((numCustomAttributes != (int *)0x0) && (*numCustomAttributes < 0x80)) {
                        puts("custom");
                        attrib.name = strdup(attrName._M_dataplus._M_p);
                        attrib.type = strdup(attrType._M_dataplus._M_p);
                        attrib.size = (int)((long)data.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)data.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start);
                        puVar12 = (uchar *)malloc((long)data.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)data.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                        attrib.value = puVar12;
                        __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           &data.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ,0);
                        memcpy(puVar12,__src,
                               (long)data.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)data.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                        std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::push_back
                                  (&attribs,&attrib);
                      }
                      goto LAB_00139727;
                    }
                  }
                  sStack_140 = 0;
                }
LAB_0013971f:
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                           sStack_140);
              }
            }
          }
LAB_00139727:
          iVar7 = 0;
          puVar12 = puVar8;
          iVar6 = iVar13;
        }
LAB_00139734:
        iVar13 = iVar6;
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::__cxx11::string::~string((string *)&attrType);
        std::__cxx11::string::~string((string *)&attrName);
      } while (iVar7 == 0);
      if (iVar7 == 2) {
        if (local_120 < 0) {
          __assert_fail("dx >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                        ,0x22d0,
                        "int ParseEXRHeaderFromMemory(EXRAttribute *, int *, int *, int *, const unsigned char *)"
                       );
        }
        if (local_124 < 0) {
          __assert_fail("dy >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                        ,0x22d1,
                        "int ParseEXRHeaderFromMemory(EXRAttribute *, int *, int *, int *, const unsigned char *)"
                       );
        }
        if (local_128 < 0) {
          __assert_fail("dw >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                        ,0x22d2,
                        "int ParseEXRHeaderFromMemory(EXRAttribute *, int *, int *, int *, const unsigned char *)"
                       );
        }
        if (local_12c < 0) {
          __assert_fail("dh >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                        ,0x22d3,
                        "int ParseEXRHeaderFromMemory(EXRAttribute *, int *, int *, int *, const unsigned char *)"
                       );
        }
        if ((int)local_f0 < 1) {
          __assert_fail("numChannels >= 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                        ,0x22d4,
                        "int ParseEXRHeaderFromMemory(EXRAttribute *, int *, int *, int *, const unsigned char *)"
                       );
        }
        *width = (local_128 - local_120) + 1;
        *height = (local_12c - local_124) + 1;
        if (numCustomAttributes == (int *)0x0) {
          iVar13 = 0;
        }
        else {
          uVar10 = (long)attribs.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)attribs.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 5;
          if (0x7f < uVar10) {
            __assert_fail("attribs.size() < TINYEXR_MAX_ATTRIBUTES",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                          ,0x22dd,
                          "int ParseEXRHeaderFromMemory(EXRAttribute *, int *, int *, int *, const unsigned char *)"
                         );
          }
          *numCustomAttributes = (int)uVar10;
          iVar13 = 0;
          lVar11 = 0;
          while (bVar14 = uVar10 != 0, uVar10 = uVar10 - 1, bVar14) {
            puVar1 = (undefined8 *)
                     ((long)&(attribs.
                              super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
                              _M_impl.super__Vector_impl_data._M_start)->name + lVar11);
            uVar3 = puVar1[1];
            uVar4 = puVar1[2];
            uVar5 = puVar1[3];
            puVar2 = (undefined8 *)((long)&customAttributes->name + lVar11);
            *puVar2 = *puVar1;
            puVar2[1] = uVar3;
            puVar2[2] = uVar4;
            puVar2[3] = uVar5;
            lVar11 = lVar11 + 0x20;
          }
        }
      }
      std::_Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>::~_Vector_base
                (&attribs.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>);
      std::
      vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ::~vector(&channels);
    }
  }
  else {
    iVar13 = -3;
  }
  return iVar13;
}

Assistant:

int ParseEXRHeaderFromMemory(EXRAttribute* customAttributes, int *numCustomAttributes, int *width, int *height,
                             const unsigned char *memory) {

  if (memory == NULL) {
    // Invalid argument
    return -1;
  }

  const char *buf = reinterpret_cast<const char *>(memory);

  const char *marker = &buf[0];

  // Header check.
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};

    if (memcmp(marker, header, 4) != 0) {
      // if (err) {
      //  (*err) = "Header mismatch.";
      //}
      return -3;
    }
    marker += 4;
  }

  // Version, scanline.
  {
    // must be [2, 0, 0, 0]
    if (marker[0] != 2 || marker[1] != 0 || marker[2] != 0 || marker[3] != 0) {
      // if (err) {
      //  (*err) = "Unsupported version or scanline.";
      //}
      return -4;
    }

    marker += 4;
  }

  int dx = -1;
  int dy = -1;
  int dw = -1;
  int dh = -1;
  int lineOrder = 0; // @fixme
  int displayWindow[4] = {-1, -1, -1, -1}; // @fixme
  float screenWindowCenter[2] = {0.0f, 0.0f}; // @fixme
  float screenWindowWidth = 1.0f; // @fixme
  int numChannels = -1;
  float pixelAspectRatio = 1.0f; // @fixme
  std::vector<ChannelInfo> channels;
  std::vector<EXRAttribute> attribs;

  if (numCustomAttributes) {
    (*numCustomAttributes) = 0;
  }

  // Read attributes
  for (;;) {
    std::string attrName;
    std::string attrType;
    std::vector<unsigned char> data;
    const char *marker_next = ReadAttribute(attrName, attrType, data, marker);
    if (marker_next == NULL) {
      marker++; // skip '\0'
      break;
    }

    if (attrName.compare("compression") == 0) {
      // must be 0:No compression, 1: RLE or 3: ZIP
      //      if (data[0] != 0 && data[0] != 1 && data[0] != 3) {

      //	mwkm
      //	0 : NO_COMPRESSION
      //	1 : RLE
      //	2 : ZIPS (Single scanline)
      //	3 : ZIP (16-line block)
      //	4 : PIZ (32-line block)
      if (data[0] > 4) {
        // if (err) {
        //  (*err) = "Unsupported compression type.";
        //}
        return -5;
      }

    } else if (attrName.compare("channels") == 0) {

      // name: zero-terminated string, from 1 to 255 bytes long
      // pixel type: int, possible values are: UINT = 0 HALF = 1 FLOAT = 2
      // pLinear: unsigned char, possible values are 0 and 1
      // reserved: three chars, should be zero
      // xSampling: int
      // ySampling: int

      ReadChannelInfo(channels, data);

      numChannels = channels.size();

      if (numChannels < 1) {
        // if (err) {
        //  (*err) = "Invalid channels format.";
        //}
        return -6;
      }

    } else if (attrName.compare("dataWindow") == 0) {
      memcpy(&dx, &data.at(0), sizeof(int));
      memcpy(&dy, &data.at(4), sizeof(int));
      memcpy(&dw, &data.at(8), sizeof(int));
      memcpy(&dh, &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&dx));
        swap4(reinterpret_cast<unsigned int *>(&dy));
        swap4(reinterpret_cast<unsigned int *>(&dw));
        swap4(reinterpret_cast<unsigned int *>(&dh));
      }
    } else if (attrName.compare("displayWindow") == 0) {
      memcpy(&displayWindow[0], &data.at(0), sizeof(int));
      memcpy(&displayWindow[1], &data.at(4), sizeof(int));
      memcpy(&displayWindow[2], &data.at(8), sizeof(int));
      memcpy(&displayWindow[3], &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[0]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[1]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[2]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[3]));
      }
    } else if (attrName.compare("lineOrder") == 0) {
      memcpy(&lineOrder, &data.at(0), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&lineOrder));
      }
    } else if (attrName.compare("pixelAspectRatio") == 0) {
      memcpy(&pixelAspectRatio, &data.at(0), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&pixelAspectRatio));
      }
    } else if (attrName.compare("screenWindowCenter") == 0) {
      memcpy(&screenWindowCenter[0], &data.at(0), sizeof(float));
      memcpy(&screenWindowCenter[1], &data.at(4), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&screenWindowCenter[0]));
        swap4(reinterpret_cast<unsigned int *>(&screenWindowCenter[1]));
      }
    } else if (attrName.compare("screenWindowWidth") == 0) {
      memcpy(&screenWindowWidth, &data.at(0), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&screenWindowWidth));
      }
      
    } else {
      // Custom attribute(up to TINYEXR_MAX_ATTRIBUTES)
      if (numCustomAttributes && ((*numCustomAttributes) < TINYEXR_MAX_ATTRIBUTES)) {
        printf("custom\n");
        EXRAttribute attrib;
        attrib.name = strdup(attrName.c_str());
        attrib.type = strdup(attrType.c_str());
        attrib.size = data.size();
        attrib.value = (unsigned char*)malloc(data.size());
        memcpy((char*)attrib.value, &data.at(0), data.size());
        attribs.push_back(attrib);
      }
    }

    marker = marker_next;
  }

  assert(dx >= 0);
  assert(dy >= 0);
  assert(dw >= 0);
  assert(dh >= 0);
  assert(numChannels >= 1);

  int dataWidth = dw - dx + 1;
  int dataHeight = dh - dy + 1;

  (*width) = dataWidth;
  (*height) = dataHeight;

  if (numCustomAttributes) {
    assert(attribs.size() < TINYEXR_MAX_ATTRIBUTES);
    (*numCustomAttributes) = attribs.size();

    // Assume the pointer to customAttributes has enough memory to store.
    for (int i = 0; i < (int)attribs.size(); i++) {
      customAttributes[i] = attribs[i];
    }
  } 

  return 0;
}